

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

Approx * __thiscall
doctest::Approx::operator()(Approx *__return_storage_ptr__,Approx *this,double value)

{
  double dVar1;
  
  __return_storage_ptr__->m_value = value;
  dVar1 = this->m_scale;
  __return_storage_ptr__->m_epsilon = this->m_epsilon;
  __return_storage_ptr__->m_scale = dVar1;
  return __return_storage_ptr__;
}

Assistant:

Approx Approx::operator()(double value) const {
    Approx approx(value);
    approx.epsilon(m_epsilon);
    approx.scale(m_scale);
    return approx;
}